

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O1

int Sbd_StoObjBestCut(Sbd_Sto_t *p,int iObj,int nSize,int *pLeaves)

{
  uint uVar1;
  Sbd_Cut_t *pSVar2;
  uint uVar3;
  ulong uVar4;
  Sbd_Cut_t *pSVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  if (p->Pivot != iObj) {
    __assert_fail("p->Pivot == iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x326,"int Sbd_StoObjBestCut(Sbd_Sto_t *, int, int, int *)");
  }
  if ((long)p->nCutsR < 1) {
    pSVar5 = (Sbd_Cut_t *)0x0;
  }
  else {
    lVar6 = 0;
    pSVar5 = (Sbd_Cut_t *)0x0;
    do {
      if ((nSize == 0) || (*(uint *)&p->ppCuts[lVar6]->field_0x14 >> 0x1c == nSize)) {
        pSVar2 = p->ppCuts[lVar6];
        uVar3 = *(uint *)&pSVar2->field_0x14;
        if (((uVar3 & 0x3fc00) == 0 && p->nLutSize < (int)(uVar3 >> 0x1c)) &&
           ((int)(uVar3 >> 0x12 & 0x3ff) < p->nLutSize)) {
          if (pSVar5 != (Sbd_Cut_t *)0x0) {
            if ((uVar3 < 0x50000000) || (uVar1 = *(uint *)&pSVar5->field_0x14, uVar1 < 0x50000000))
            {
              __assert_fail("pCut0->nLeaves > 4 && pCut1->nLeaves > 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                            ,0x13e,"int Sbd_CutCompare2(Sbd_Cut_t *, Sbd_Cut_t *)");
            }
            uVar8 = uVar1 >> 9 & 0x1ff;
            uVar7 = uVar3 >> 9 & 1;
            if (uVar8 < uVar7) goto LAB_0053c472;
            if (uVar8 <= uVar7) {
              if ((uVar1 & 0x1ff) < (uVar3 & 0x1ff)) goto LAB_0053c472;
              if ((uVar1 & 0x1ff) <= (uVar3 & 0x1ff)) {
                if (pSVar5->Cost < pSVar2->Cost) goto LAB_0053c472;
                if (pSVar5->Cost <= pSVar2->Cost) {
                  if ((pSVar5->CostLev < pSVar2->CostLev) ||
                     (pSVar5->CostLev <= pSVar2->CostLev && uVar1 >> 0x1c <= uVar3 >> 0x1c))
                  goto LAB_0053c472;
                }
              }
            }
          }
          pSVar5 = pSVar2;
        }
      }
LAB_0053c472:
      lVar6 = lVar6 + 1;
    } while (p->nCutsR != lVar6);
  }
  if (pSVar5 == (Sbd_Cut_t *)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    if (0xafffffff < *(uint *)&pSVar5->field_0x14) {
      __assert_fail("pCutBest->nLeaves <= SBD_DIV_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                    ,0x33c,"int Sbd_StoObjBestCut(Sbd_Sto_t *, int, int, int *)");
    }
    if (*(uint *)&pSVar5->field_0x14 < 0x10000000) {
      uVar3 = *(uint *)&pSVar5->field_0x14 >> 0x1c;
    }
    else {
      uVar4 = 0;
      do {
        pLeaves[uVar4] = pSVar5->pLeaves[uVar4];
        uVar4 = uVar4 + 1;
        uVar3 = *(uint *)&pSVar5->field_0x14 >> 0x1c;
      } while (uVar4 < uVar3);
    }
  }
  return uVar3;
}

Assistant:

int Sbd_StoObjBestCut( Sbd_Sto_t * p, int iObj, int nSize, int * pLeaves )
{
    int fVerbose = 0;
    Sbd_Cut_t * pCutBest = NULL;   int i;
    assert( p->Pivot == iObj );
    if ( fVerbose && iObj % 1000 == 0 )
        printf( "Node %6d : \n", iObj );
    for ( i = 0; i < p->nCutsR; i++ )
    {
        if ( fVerbose && iObj % 1000 == 0 )
            Sbd_CutPrint( p, iObj, p->ppCuts[i] );
        if ( nSize && (int)p->ppCuts[i]->nLeaves != nSize )
            continue;
        if ( (int)p->ppCuts[i]->nLeaves > p->nLutSize && 
             (int)p->ppCuts[i]->nSlowLeaves <= 1 &&
             (int)p->ppCuts[i]->nTopLeaves <= p->nLutSize-1 &&
             (pCutBest == NULL || Sbd_CutCompare2(pCutBest, p->ppCuts[i]) == 1) )
            pCutBest = p->ppCuts[i];
    }
    if ( fVerbose && iObj % 1000 == 0 )
    {
        printf( "Best cut of size %d:\n", nSize );
        Sbd_CutPrint( p, iObj, pCutBest );
    }
    if ( pCutBest == NULL )
        return -1;
    assert( pCutBest->nLeaves <= SBD_DIV_MAX );
    for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
        pLeaves[i] = pCutBest->pLeaves[i];
    return pCutBest->nLeaves;
}